

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.hpp
# Opt level: O0

void __thiscall
Diligent::EngineFactoryBase<Diligent::IEngineFactoryVk>::
CreateDearchiver<Diligent::DearchiverVkImpl>
          (EngineFactoryBase<Diligent::IEngineFactoryVk> *this,DearchiverCreateInfo *CreateInfo,
          IDearchiver **ppDearchiver)

{
  bool bVar1;
  IMemoryAllocator *Allocator;
  DearchiverVkImpl *pDVar2;
  MakeNewRCObj<Diligent::DearchiverVkImpl,_Diligent::IMemoryAllocator> local_50;
  RefCntAutoPtr<Diligent::DearchiverVkImpl> local_28;
  RefCntAutoPtr<Diligent::DearchiverVkImpl> pDearchiver;
  IDearchiver **ppDearchiver_local;
  DearchiverCreateInfo *CreateInfo_local;
  EngineFactoryBase<Diligent::IEngineFactoryVk> *this_local;
  
  if (ppDearchiver != (IDearchiver **)0x0) {
    *ppDearchiver = (IDearchiver *)0x0;
    pDearchiver.m_pObject = (DearchiverVkImpl *)ppDearchiver;
    Allocator = GetRawAllocator();
    MakeNewRCObj<Diligent::DearchiverVkImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
              (&local_50,Allocator,"Dearchiver instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/EngineFactoryBase.hpp"
               ,0x86,(IObject *)0x0);
    pDVar2 = MakeNewRCObj<Diligent::DearchiverVkImpl,Diligent::IMemoryAllocator>::operator()
                       ((MakeNewRCObj<Diligent::DearchiverVkImpl,Diligent::IMemoryAllocator> *)
                        &local_50,CreateInfo);
    RefCntAutoPtr<Diligent::DearchiverVkImpl>::RefCntAutoPtr(&local_28,pDVar2);
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&local_28);
    if (bVar1) {
      pDVar2 = RefCntAutoPtr<Diligent::DearchiverVkImpl>::operator->(&local_28);
      (**(pDVar2->super_DearchiverBase).super_ObjectBase<Diligent::IDearchiver>.
         super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
      )(pDVar2,IID_Dearchiver,pDearchiver.m_pObject);
    }
    RefCntAutoPtr<Diligent::DearchiverVkImpl>::~RefCntAutoPtr(&local_28);
  }
  return;
}

Assistant:

void CreateDearchiver(const DearchiverCreateInfo& CreateInfo,
                          IDearchiver**               ppDearchiver) const
    {
        if (ppDearchiver == nullptr)
            return;

        *ppDearchiver = nullptr;
        RefCntAutoPtr<DearchiverImplType> pDearchiver{NEW_RC_OBJ(GetRawAllocator(), "Dearchiver instance", DearchiverImplType)(CreateInfo)};

        if (pDearchiver)
            pDearchiver->QueryInterface(IID_Dearchiver, reinterpret_cast<IObject**>(ppDearchiver));
    }